

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_generated.h
# Opt level: O3

bool __thiscall reflection::Enum::Verify(Enum *this,Verifier *verifier)

{
  bool bVar1;
  ulong uVar2;
  long lVar3;
  String *pSVar4;
  Vector<flatbuffers::Offset<reflection::EnumVal>,_unsigned_int> *vec;
  Vector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int> *vec_00;
  Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int> *vec_01;
  
  bVar1 = flatbuffers::VerifierTemplate<false>::VerifyTableStart(verifier,(uint8_t *)this);
  if ((bVar1) &&
     (bVar1 = flatbuffers::Table::VerifyOffsetRequired<unsigned_int>(&this->super_Table,verifier,4),
     bVar1)) {
    if ((*(ushort *)(this + -(long)*(int *)this) < 5) ||
       (uVar2 = (ulong)*(ushort *)(this + (4 - (long)*(int *)this)), uVar2 == 0)) {
      pSVar4 = (String *)0x0;
    }
    else {
      pSVar4 = (String *)(this + *(uint *)(this + uVar2) + uVar2);
    }
    bVar1 = flatbuffers::VerifierTemplate<false>::VerifyString(verifier,pSVar4);
    if ((bVar1) &&
       (bVar1 = flatbuffers::Table::VerifyOffsetRequired<unsigned_int>
                          (&this->super_Table,verifier,6), bVar1)) {
      lVar3 = -(long)*(int *)this;
      if ((6 < *(ushort *)(this + -(long)*(int *)this)) &&
         (uVar2 = (ulong)*(ushort *)(this + lVar3 + 6), uVar2 != 0)) {
        bVar1 = flatbuffers::VerifierTemplate<false>::VerifyVectorOrString<unsigned_int>
                          (verifier,(uint8_t *)(this + *(uint *)(this + uVar2) + uVar2),4,
                           (size_t *)0x0);
        if (!bVar1) {
          return false;
        }
        lVar3 = -(long)*(int *)this;
      }
      if ((*(ushort *)(this + lVar3) < 7) ||
         (uVar2 = (ulong)*(ushort *)(this + lVar3 + 6), uVar2 == 0)) {
        vec = (Vector<flatbuffers::Offset<reflection::EnumVal>,_unsigned_int> *)0x0;
      }
      else {
        vec = (Vector<flatbuffers::Offset<reflection::EnumVal>,_unsigned_int> *)
              (this + *(uint *)(this + uVar2) + uVar2);
      }
      bVar1 = flatbuffers::VerifierTemplate<false>::VerifyVectorOfTables<reflection::EnumVal>
                        (verifier,vec);
      if (bVar1) {
        if ((8 < *(ushort *)(this + -(long)*(int *)this)) &&
           ((ulong)*(ushort *)(this + (8 - (long)*(int *)this)) != 0)) {
          if (verifier->size_ < 2) {
            return false;
          }
          if ((Enum *)(verifier->size_ - 1) <
              this + ((ulong)*(ushort *)(this + (8 - (long)*(int *)this)) - (long)verifier->buf_)) {
            return false;
          }
        }
        bVar1 = flatbuffers::Table::VerifyOffsetRequired<unsigned_int>
                          (&this->super_Table,verifier,10);
        if ((bVar1) &&
           ((((*(ushort *)(this + -(long)*(int *)this) < 0xb ||
              (uVar2 = (ulong)*(ushort *)(this + (10 - (long)*(int *)this)), uVar2 == 0)) ||
             (bVar1 = Type::Verify((Type *)(this + *(uint *)(this + uVar2) + uVar2),verifier), bVar1
             )) && (bVar1 = flatbuffers::Table::VerifyOffset<unsigned_int>
                                      (&this->super_Table,verifier,0xc), bVar1)))) {
          lVar3 = -(long)*(int *)this;
          if ((0xc < *(ushort *)(this + -(long)*(int *)this)) &&
             (uVar2 = (ulong)*(ushort *)(this + lVar3 + 0xc), uVar2 != 0)) {
            bVar1 = flatbuffers::VerifierTemplate<false>::VerifyVectorOrString<unsigned_int>
                              (verifier,(uint8_t *)(this + *(uint *)(this + uVar2) + uVar2),4,
                               (size_t *)0x0);
            if (!bVar1) {
              return false;
            }
            lVar3 = -(long)*(int *)this;
          }
          if ((*(ushort *)(this + lVar3) < 0xd) ||
             (uVar2 = (ulong)*(ushort *)(this + lVar3 + 0xc), uVar2 == 0)) {
            vec_00 = (Vector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int> *)0x0;
          }
          else {
            vec_00 = (Vector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int> *)
                     (this + *(uint *)(this + uVar2) + uVar2);
          }
          bVar1 = flatbuffers::VerifierTemplate<false>::VerifyVectorOfTables<reflection::KeyValue>
                            (verifier,vec_00);
          if ((bVar1) &&
             (bVar1 = flatbuffers::Table::VerifyOffset<unsigned_int>
                                (&this->super_Table,verifier,0xe), bVar1)) {
            lVar3 = -(long)*(int *)this;
            if ((0xe < *(ushort *)(this + -(long)*(int *)this)) &&
               (uVar2 = (ulong)*(ushort *)(this + lVar3 + 0xe), uVar2 != 0)) {
              bVar1 = flatbuffers::VerifierTemplate<false>::VerifyVectorOrString<unsigned_int>
                                (verifier,(uint8_t *)(this + *(uint *)(this + uVar2) + uVar2),4,
                                 (size_t *)0x0);
              if (!bVar1) {
                return false;
              }
              lVar3 = -(long)*(int *)this;
            }
            if ((*(ushort *)(this + lVar3) < 0xf) ||
               (uVar2 = (ulong)*(ushort *)(this + lVar3 + 0xe), uVar2 == 0)) {
              vec_01 = (Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int> *)0x0;
            }
            else {
              vec_01 = (Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int> *)
                       (this + *(uint *)(this + uVar2) + uVar2);
            }
            bVar1 = flatbuffers::VerifierTemplate<false>::VerifyVectorOfStrings(verifier,vec_01);
            if ((bVar1) &&
               (bVar1 = flatbuffers::Table::VerifyOffset<unsigned_int>
                                  (&this->super_Table,verifier,0x10), bVar1)) {
              if ((*(ushort *)(this + -(long)*(int *)this) < 0x11) ||
                 (uVar2 = (ulong)*(ushort *)(this + (0x10 - (long)*(int *)this)), uVar2 == 0)) {
                pSVar4 = (String *)0x0;
              }
              else {
                pSVar4 = (String *)(this + *(uint *)(this + uVar2) + uVar2);
              }
              bVar1 = flatbuffers::VerifierTemplate<false>::VerifyString(verifier,pSVar4);
              if (bVar1) {
                verifier->depth_ = verifier->depth_ - 1;
                return true;
              }
            }
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool Verify(::flatbuffers::Verifier &verifier) const {
    return VerifyTableStart(verifier) &&
           VerifyOffsetRequired(verifier, VT_NAME) &&
           verifier.VerifyString(name()) &&
           VerifyOffsetRequired(verifier, VT_VALUES) &&
           verifier.VerifyVector(values()) &&
           verifier.VerifyVectorOfTables(values()) &&
           VerifyField<uint8_t>(verifier, VT_IS_UNION, 1) &&
           VerifyOffsetRequired(verifier, VT_UNDERLYING_TYPE) &&
           verifier.VerifyTable(underlying_type()) &&
           VerifyOffset(verifier, VT_ATTRIBUTES) &&
           verifier.VerifyVector(attributes()) &&
           verifier.VerifyVectorOfTables(attributes()) &&
           VerifyOffset(verifier, VT_DOCUMENTATION) &&
           verifier.VerifyVector(documentation()) &&
           verifier.VerifyVectorOfStrings(documentation()) &&
           VerifyOffset(verifier, VT_DECLARATION_FILE) &&
           verifier.VerifyString(declaration_file()) &&
           verifier.EndTable();
  }